

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool google::protobuf::TextFormat::PrintUnknownFields
               (UnknownFieldSet *unknown_fields,ZeroCopyOutputStream *output)

{
  bool bVar1;
  Printer *this;
  Printer *in_stack_ffffffffffffff70;
  ZeroCopyOutputStream *in_stack_ffffffffffffff90;
  _Base_ptr in_stack_ffffffffffffff98;
  Printer *in_stack_ffffffffffffffa0;
  
  this = (Printer *)&stack0xffffffffffffff68;
  Printer::Printer(in_stack_ffffffffffffff70);
  bVar1 = Printer::PrintUnknownFields
                    (in_stack_ffffffffffffffa0,(UnknownFieldSet *)in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff90);
  Printer::~Printer(this);
  return bVar1;
}

Assistant:

bool TextFormat::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields, io::ZeroCopyOutputStream* output) {
  return Printer().PrintUnknownFields(unknown_fields, output);
}